

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O0

void __thiscall VulkanUtilities::VulkanMemoryPage::~VulkanMemoryPage(VulkanMemoryPage *this)

{
  VulkanLogicalDevice *this_00;
  bool bVar1;
  VkDeviceMemory_T *memory;
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  VulkanMemoryPage *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_CPUMemory != (void *)0x0) {
    this_00 = this->m_ParentMemoryMgr->m_LogicalDevice;
    memory = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDeviceMemory_T_
                       ((VulkanObjectWrapper *)&this->m_VkMemory);
    VulkanLogicalDevice::UnmapMemory(this_00,memory);
  }
  bVar1 = IsEmpty(this);
  if (!bVar1) {
    Diligent::FormatString<char[52]>
              ((string *)local_30,
               (char (*) [52])"Destroying a page with not all allocations released");
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"~VulkanMemoryPage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0x60);
    std::__cxx11::string::~string((string *)local_30);
  }
  VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  ~VulkanObjectWrapper(&this->m_VkMemory);
  Diligent::VariableSizeAllocationsManager::~VariableSizeAllocationsManager(&this->m_AllocationMgr);
  return;
}

Assistant:

VulkanMemoryPage::~VulkanMemoryPage()
{
    if (m_CPUMemory != nullptr)
    {
        // Unmapping memory is not necessary, byt anyway
        m_ParentMemoryMgr.m_LogicalDevice.UnmapMemory(m_VkMemory);
    }

    VERIFY(IsEmpty(), "Destroying a page with not all allocations released");
}